

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<kj::HttpClient::Response>::detach
          (WeakFulfiller<kj::HttpClient::Response> *this,
          PromiseFulfiller<kj::HttpClient::Response> *from)

{
  PromiseFulfiller<kj::HttpClient::Response> *pPVar1;
  PromiseFulfiller<kj::HttpClient::Response> *from_local;
  WeakFulfiller<kj::HttpClient::Response> *this_local;
  
  pPVar1 = WeakFulfillerBase::getInner<kj::HttpClient::Response>(&this->super_WeakFulfillerBase);
  if (pPVar1 == (PromiseFulfiller<kj::HttpClient::Response> *)0x0) {
    if (this != (WeakFulfiller<kj::HttpClient::Response> *)0x0) {
      ~WeakFulfiller(this);
      operator_delete(this,0x18);
    }
  }
  else {
    pPVar1 = WeakFulfillerBase::getInner<kj::HttpClient::Response>(&this->super_WeakFulfillerBase);
    if (pPVar1 != from) {
      inlineRequireFailure
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
                 ,0x6d8,"getInner<T>() == &from","",(char *)0x0);
    }
    WeakFulfillerBase::setInner<kj::HttpClient::Response>
              (&this->super_WeakFulfillerBase,(PromiseFulfiller<kj::HttpClient::Response> *)0x0);
  }
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (getInner<T>() == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(getInner<T>() == &from);
      setInner<T>(nullptr);
    }
  }